

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O3

_HashNode * __thiscall SQTable::_Get(SQTable *this,SQObjectPtr *key)

{
  SQObjectType SVar1;
  SQGenerator *pSVar2;
  SQFloat SVar3;
  _HashNode *p_Var4;
  SQObjectValue SVar5;
  
  SVar1 = (key->super_SQObject)._type;
  if ((int)SVar1 < 0x5000002) {
    if (SVar1 == OT_NULL) {
      return (_HashNode *)0x0;
    }
    if (SVar1 == OT_BOOL) goto LAB_0013f116;
  }
  else {
    if (SVar1 == OT_INTEGER) {
LAB_0013f116:
      SVar5 = (key->super_SQObject)._unVal;
      SVar3 = SVar5.fFloat;
      goto LAB_0013f136;
    }
    if (SVar1 == OT_FLOAT) {
      SVar3 = (SQFloat)(long)(key->super_SQObject)._unVal.fFloat;
      SVar5 = (SQObjectValue)(key->super_SQObject)._unVal.pTable;
      goto LAB_0013f136;
    }
    if (SVar1 == OT_STRING) {
      pSVar2 = (key->super_SQObject)._unVal.pGenerator;
      p_Var4 = this->_nodes +
               ((pSVar2->_closure).super_SQObject._type & this->_numofnodes_minus_one);
      while (((SQGenerator *)(p_Var4->key).super_SQObject._unVal.pTable != pSVar2 ||
             ((p_Var4->key).super_SQObject._type != OT_STRING))) {
        p_Var4 = p_Var4->next;
        if (p_Var4 == (_HashNode *)0x0) {
          return (_HashNode *)0x0;
        }
      }
      return p_Var4;
    }
  }
  SVar5 = (SQObjectValue)(key->super_SQObject)._unVal.nInteger;
  SVar3 = (SQFloat)(SVar5.nInteger >> 4);
LAB_0013f136:
  p_Var4 = this->_nodes + ((uint)SVar3 & this->_numofnodes_minus_one);
  while (((p_Var4->key).super_SQObject._unVal.pTable != SVar5.pTable ||
         ((p_Var4->key).super_SQObject._type != SVar1))) {
    p_Var4 = p_Var4->next;
    if (p_Var4 == (_HashNode *)0x0) {
      return (_HashNode *)0x0;
    }
  }
  return p_Var4;
}

Assistant:

SQTable::_HashNode *SQTable::_Get(const SQObjectPtr &key) const
{
    if(sq_type(key) == OT_NULL)
        return nullptr;

    if (sq_type(key) == OT_STRING)
        return _GetStr(_rawval(key), _string(key)->_hash & _numofnodes_minus_one);
    else
        return _Get(key, HashObj(key) & _numofnodes_minus_one);
}